

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_add_asn1_bool(CBB *cbb,int value)

{
  int iVar1;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  uint64_t v;
  CBB child;
  CBB local_40;
  
  iVar1 = CBB_add_asn1(cbb,&local_40,1);
  if (iVar1 != 0) {
    v = 0xff;
    if (value == 0) {
      v = 0;
    }
    iVar1 = cbb_add_u(&local_40,v,1);
    if ((iVar1 != 0) && (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
      return 1;
    }
  }
  paVar2 = &cbb->u;
  if (cbb->is_child != '\0') {
    paVar2 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar2->base).buf;
  }
  *(byte *)((long)paVar2 + 0x18) = *(byte *)((long)paVar2 + 0x18) | 2;
  cbb->child = (CBB *)0x0;
  return 0;
}

Assistant:

int CBB_add_asn1_bool(CBB *cbb, int value) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_BOOLEAN) ||
      !CBB_add_u8(&child, value != 0 ? 0xff : 0) || !CBB_flush(cbb)) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}